

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_f33f06::HandleHashCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view input;
  string_view value;
  string_view algo;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  string out;
  string local_70;
  string local_50;
  char *local_30;
  undefined8 local_28;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    algo._M_str = (char *)pbVar1->_M_string_length;
    algo._M_len = (size_t)&local_70;
    cmCryptoHash::New(algo);
    bVar2 = (cmCryptoHash *)local_70._M_dataplus._M_p != (cmCryptoHash *)0x0;
    if (bVar2) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      input._M_str = pbVar1[2]._M_dataplus._M_p;
      input._M_len = pbVar1[2]._M_string_length;
      cmCryptoHash::HashString_abi_cxx11_(&local_50,(cmCryptoHash *)local_70._M_dataplus._M_p,input)
      ;
      value._M_str = local_50._M_dataplus._M_p;
      value._M_len = local_50._M_string_length;
      cmMakefile::AddDefinition
                (status->Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1,value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
              ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)&local_70);
  }
  else {
    local_50._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
    local_50.field_2._M_allocated_capacity = 0;
    local_50.field_2._8_8_ = 0x30;
    local_30 = " requires an output variable and an input string";
    local_28 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_50;
    cmCatViews(&local_70,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HandleHashCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("HASH must be called with two arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  const auto& output = args[2];

  if (output.empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  auto hash = hash_value(cmCMakePath(inputPath).Normal());

  std::ostringstream out;
  out << std::setbase(16) << hash;

  status.GetMakefile().AddDefinition(output, out.str());

  return true;
}